

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableValue.cpp
# Opt level: O0

void __thiscall VariableValue::SetValue(VariableValue *this,Value *object)

{
  __type _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  unordered_map<Symbol,_Value_*,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_Value_*>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Value *local_18;
  Value *object_local;
  VariableValue *this_local;
  
  local_18 = object;
  object_local = &this->super_Value;
  iVar2 = (*object->_vptr_Value[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))(&local_38);
  iVar2 = (*(this->super_Value)._vptr_Value[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar2))(&local_58);
  _Var1 = std::operator==(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Different types");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*local_18->_vptr_Value[3])();
  this->type_ = (PrimitiveSimpleObject *)CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*local_18->_vptr_Value[2])();
  this->value_ = iVar2;
  (*local_18->_vptr_Value[4])(&local_a0);
  std::
  unordered_map<Symbol,_Value_*,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_Value_*>_>_>
  ::operator=(&this->fields_,&local_a0);
  std::
  unordered_map<Symbol,_Value_*,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_Value_*>_>_>
  ::~unordered_map(&local_a0);
  return;
}

Assistant:

void VariableValue::SetValue(Value* object) {
  if (object->GetType()->GetTypename() == this->GetType()->GetTypename()) {
    type_ = (PrimitiveSimpleObject*)object->GetType();
  } else {
    throw std::runtime_error("Different types");
  }
  value_ = object->GetValue();
  fields_ = std::move(object->GetFields());
}